

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Country::operator=(Country *this,Country *rhs)

{
  ostream *poVar1;
  Country *rhs_local;
  Country *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"In country = operator:");
  std::operator<<(poVar1,(string *)rhs->cyName);
  this->cyID = rhs->cyID;
  this->cyName = rhs->cyName;
  this->cyContinent = rhs->cyContinent;
  this->pPlayerOwnerId = rhs->pPlayerOwnerId;
  this->pNumberOfTroops = rhs->pNumberOfTroops;
  this->pAdjCountries = rhs->pAdjCountries;
  return;
}

Assistant:

void Map::Country::operator=(Map::Country& rhs){
    std::cout << "In country = operator:" << *rhs.cyName;
    this->cyID = rhs.cyID;
    this->cyName = rhs.cyName;
    this->cyContinent = rhs.cyContinent;
    this->pPlayerOwnerId = rhs.pPlayerOwnerId;
    this->pNumberOfTroops = rhs.pNumberOfTroops;
    this->pAdjCountries = rhs.pAdjCountries;
}